

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

wchar_t scan_floor(object **items,wchar_t max_size,player *p,object_floor_t mode,item_tester tester)

{
  loc_conflict grid;
  loc_conflict grid_00;
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t local_44;
  object *poStack_40;
  wchar_t num;
  object *obj;
  item_tester tester_local;
  object_floor_t mode_local;
  player *p_local;
  wchar_t max_size_local;
  object **items_local;
  
  local_44 = L'\0';
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  _Var1 = square_in_bounds((chunk *)cave,grid);
  if (_Var1) {
    grid_00.x = (p->grid).x;
    grid_00.y = (p->grid).y;
    poStack_40 = square_object((chunk *)cave,grid_00);
    while ((poStack_40 != (object *)0x0 && (local_44 < max_size))) {
      if (((((mode & OFLOOR_TEST) == OFLOOR_NONE) || (_Var1 = object_test(tester,poStack_40), _Var1)
           ) && (((mode & OFLOOR_SENSE) == OFLOOR_NONE || (poStack_40->known != (object *)0x0)))) &&
         (((mode & OFLOOR_VISIBLE) == OFLOOR_NONE ||
          ((_Var1 = is_unknown(poStack_40), _Var1 || (_Var1 = ignore_item_ok(p,poStack_40), !_Var1))
          )))) {
        wVar2 = local_44 + L'\x01';
        items[local_44] = poStack_40;
        local_44 = wVar2;
        if ((mode & OFLOOR_TOP) != OFLOOR_NONE) break;
      }
      poStack_40 = poStack_40->next;
    }
    items_local._4_4_ = local_44;
  }
  else {
    items_local._4_4_ = L'\0';
  }
  return items_local._4_4_;
}

Assistant:

int scan_floor(struct object **items, int max_size, struct player *p,
		object_floor_t mode, item_tester tester)
{
	struct object *obj;
	int num = 0;

	/* Sanity */
	if (!square_in_bounds(cave, p->grid)) return 0;

	/* Scan all objects in the grid */
	for (obj = square_object(cave, p->grid); obj; obj = obj->next) {
		/* Enforce limit */
		if (num >= max_size) break;

		/* Item tester */
		if ((mode & OFLOOR_TEST) && !object_test(tester, obj)) continue;

		/* Sensed or known */
		if ((mode & OFLOOR_SENSE) && (!obj->known)) continue;

		/* Visible */
		if ((mode & OFLOOR_VISIBLE) && !is_unknown(obj)
				&& ignore_item_ok(p, obj)) continue;

		/* Accept this item */
		items[num++] = obj;

		/* Only one */
		if (mode & OFLOOR_TOP) break;
	}

	return num;
}